

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O3

void connection_close_cb(uv_handle_t *handle)

{
  int *piVar1;
  long extraout_RAX;
  long lVar2;
  undefined8 *__ptr;
  
  __ptr = (undefined8 *)handle->data;
  piVar1 = (int *)((long)__ptr + 0x154);
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  if (test_mode == '\x01') {
    lVar2 = __ptr[0x28];
    if (*(int *)(__ptr + 0x2a) != 0) {
      if (lVar2 == 0x10000) {
        if (__ptr[0x29] == 0) goto LAB_0017450f;
        connection_close_cb_cold_2();
        goto LAB_001744eb;
      }
      goto LAB_001744f8;
    }
LAB_001744fd:
    if (lVar2 != 0) goto LAB_00174520;
  }
  else {
LAB_001744eb:
    if (__ptr[0x28] != 0x10000) {
LAB_001744f8:
      connection_close_cb_cold_1();
      lVar2 = extraout_RAX;
      goto LAB_001744fd;
    }
  }
  if (__ptr[0x29] == 0x10000) {
LAB_0017450f:
    closed_connections = closed_connections + 1;
    free(__ptr);
    return;
  }
  connection_close_cb_cold_4();
LAB_00174520:
  connection_close_cb_cold_3();
  free((void *)*__ptr);
  return;
}

Assistant:

static void connection_close_cb(uv_handle_t* handle) {
  connection_context_t* context = (connection_context_t*) handle->data;

  if (--context->open_handles == 0) {
    if (test_mode == DUPLEX || context->is_server_connection) {
      ASSERT(context->read == TRANSFER_BYTES);
    } else {
      ASSERT(context->read == 0);
    }

    if (test_mode == DUPLEX || !context->is_server_connection) {
      ASSERT(context->sent == TRANSFER_BYTES);
    } else {
      ASSERT(context->sent == 0);
    }

    closed_connections++;

    free(context);
  }
}